

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_batch_collector.hpp
# Opt level: O1

void __thiscall duckdb::ArrowBatchGlobalState::~ArrowBatchGlobalState(ArrowBatchGlobalState *this)

{
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var1;
  
  (this->super_BatchCollectorGlobalState).super_GlobalSinkState._vptr_GlobalSinkState =
       (_func_int **)&PTR__BatchCollectorGlobalState_019c38e8;
  _Var1._M_head_impl =
       (this->super_BatchCollectorGlobalState).result.
       super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
       super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
       super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (QueryResult *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseQueryResult + 8))();
  }
  (this->super_BatchCollectorGlobalState).result.
  super_unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>.
  super__Head_base<0UL,_duckdb::QueryResult_*,_false>._M_head_impl = (QueryResult *)0x0;
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::~vector
            (&(this->super_BatchCollectorGlobalState).data.last_collection.append_state.vector_data.
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
            );
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&(this->super_BatchCollectorGlobalState).data.last_collection.append_state);
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>_>
  ::~_Rb_tree(&(this->super_BatchCollectorGlobalState).data.data._M_t);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&(this->super_BatchCollectorGlobalState).data.types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_BatchCollectorGlobalState).super_GlobalSinkState.
              super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  operator_delete(this);
  return;
}

Assistant:

ArrowBatchGlobalState(ClientContext &context, const PhysicalBatchCollector &op)
	    : BatchCollectorGlobalState(context, op) {
	}